

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Test
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *__x;
  size_t sVar6;
  char *__end;
  long lVar7;
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_d0;
  GlobalTargetInfo local_c8;
  char *__s;
  
  this_00 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_c8.Name._M_dataplus._M_p = (pointer)&local_c8.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_TESTING_ENABLED","");
  bVar4 = cmMakefile::IsOn(this_00,&local_c8.Name);
  local_d0 = targets;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.Name._M_dataplus._M_p != &local_c8.Name.field_2) {
    operator_delete(local_c8.Name._M_dataplus._M_p,
                    CONCAT71(local_c8.Name.field_2._M_allocated_capacity._1_7_,
                             local_c8.Name.field_2._M_local_buf[0]) + 1);
  }
  if (bVar4) {
    lVar7 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,
                 *(char **)((long)&AddGlobalTarget_Test(std::vector<cmGlobalGenerator::GlobalTargetInfo,std::allocator<cmGlobalGenerator::GlobalTargetInfo>>&)
                                   ::reservedTargets + lVar7),(allocator<char> *)&local_e8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"when CTest testing is enabled","");
      bVar4 = CheckCMP0037(this,&local_c8.Name,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.Name._M_dataplus._M_p != &local_c8.Name.field_2) {
        operator_delete(local_c8.Name._M_dataplus._M_p,
                        CONCAT71(local_c8.Name.field_2._M_allocated_capacity._1_7_,
                                 local_c8.Name.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar4) {
        return;
      }
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x10);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x13])(this);
    __s = (char *)CONCAT44(extraout_var,iVar5);
    paVar1 = &local_c8.Message.field_2;
    local_c8.Name._M_dataplus._M_p = (pointer)&local_c8.Name.field_2;
    local_c8.Name._M_string_length = 0;
    local_c8.Name.field_2._M_local_buf[0] = '\0';
    local_c8.Message._M_string_length = 0;
    local_c8.Message.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_c8.WorkingDir.field_2;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.WorkingDir._M_string_length = 0;
    local_c8.WorkingDir.field_2._M_local_buf[0] = '\0';
    local_c8.UsesTerminal = false;
    local_c8.Message._M_dataplus._M_p = (pointer)paVar1;
    local_c8.WorkingDir._M_dataplus._M_p = (pointer)paVar2;
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x1c])(this);
    sVar3 = local_c8.Name._M_string_length;
    strlen((char *)CONCAT44(extraout_var_00,iVar5));
    std::__cxx11::string::_M_replace
              ((ulong)&local_c8,0,(char *)sVar3,CONCAT44(extraout_var_00,iVar5));
    std::__cxx11::string::_M_replace
              ((ulong)&local_c8.Message,0,(char *)local_c8.Message._M_string_length,0x49e0ee);
    local_c8.UsesTerminal = true;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __x = cmSystemTools::GetCTestCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_e8,__x);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"--force-new-ctest-process","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               &local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (((__s == (char *)0x0) || (*__s == '\0')) || (*__s == '.')) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"$(ARGS)","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                 &local_108);
    }
    else {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"-C","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                 &local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      sVar6 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,__s,__s + sVar6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                 &local_108);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&local_c8.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (cmCustomCommandLine *)&local_e8);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(local_d0,&local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.WorkingDir._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8.WorkingDir._M_dataplus._M_p,
                      CONCAT71(local_c8.WorkingDir.field_2._M_allocated_capacity._1_7_,
                               local_c8.WorkingDir.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8.Depends);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&local_c8.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Message._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.Message._M_dataplus._M_p,
                      CONCAT71(local_c8.Message.field_2._M_allocated_capacity._1_7_,
                               local_c8.Message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Name._M_dataplus._M_p != &local_c8.Name.field_2) {
      operator_delete(local_c8.Name._M_dataplus._M_p,
                      CONCAT71(local_c8.Name.field_2._M_allocated_capacity._1_7_,
                               local_c8.Name.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Test(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  if (!mf->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  static const auto reservedTargets = { "test", "RUN_TESTS" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CTest testing is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetTestTargetName();
  gti.Message = "Running tests...";
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCTestCommand());
  singleLine.push_back("--force-new-ctest-process");
  if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  } else // TODO: This is a hack. Should be something to do with the
         // generator
  {
    singleLine.push_back("$(ARGS)");
  }
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}